

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O0

t_GSA __thiscall egsa_stream::read_el(egsa_stream *this)

{
  t_GSA tVar1;
  ostream *this_00;
  byte *in_RDI;
  uint8_t x8_4;
  uint64_t x64_5;
  uint32_t x32_5;
  uint16_t x16_5;
  uint8_t x8_7;
  uint64_t x64_4;
  uint32_t x32_4;
  uint16_t x16_4;
  uint8_t x8_6;
  uint64_t x64_3;
  uint32_t x32_3;
  uint16_t x16_3;
  uint8_t x8_5;
  uint8_t x8;
  uint64_t x64_2;
  uint32_t x32_2;
  uint16_t x16_2;
  uint8_t x8_3;
  uint64_t x64_1;
  uint32_t x32_1;
  uint16_t x16_1;
  uint8_t x8_2;
  uint64_t x64;
  uint32_t x32;
  uint16_t x16;
  uint8_t x8_1;
  t_GSA e;
  undefined1 local_79;
  uint local_78 [2];
  uint local_70;
  ushort local_6c;
  byte local_69;
  uint local_68 [2];
  uint local_60;
  ushort local_5c;
  byte local_59;
  uint local_58 [2];
  uint local_50;
  ushort local_4c;
  byte local_4a;
  undefined1 local_49;
  uint local_48 [2];
  uint local_40;
  ushort local_3c;
  byte local_39;
  uint local_38 [2];
  uint local_30;
  ushort local_2c;
  byte local_29;
  uint local_28 [2];
  uint local_20;
  ushort local_1c;
  byte local_19 [9];
  uint local_10;
  uint uStack_c;
  uint local_8;
  undefined4 uStack_4;
  
  if ((*in_RDI & 1) == 0) {
    if ((in_RDI[1] & 1) == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,"Error: missing index files.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    switch(*(undefined4 *)(in_RDI + 0xc)) {
    case 1:
      std::istream::read((char *)(in_RDI + 0x628),(long)&local_4a);
      uStack_c = (uint)local_4a;
      break;
    case 2:
      std::istream::read((char *)(in_RDI + 0x628),(long)&local_4c);
      uStack_c = (uint)local_4c;
      break;
    case 4:
      std::istream::read((char *)(in_RDI + 0x628),(long)&local_50);
      uStack_c = local_50;
      break;
    case 8:
      std::istream::read((char *)(in_RDI + 0x628),(long)local_58);
      uStack_c = local_58[0];
    }
    switch(*(undefined4 *)(in_RDI + 8)) {
    case 1:
      std::istream::read((char *)(in_RDI + 0x628),(long)&local_59);
      local_10 = (uint)local_59;
      break;
    case 2:
      std::istream::read((char *)(in_RDI + 0x628),(long)&local_5c);
      local_10 = (uint)local_5c;
      break;
    case 4:
      std::istream::read((char *)(in_RDI + 0x628),(long)&local_60);
      local_10 = local_60;
      break;
    case 8:
      std::istream::read((char *)(in_RDI + 0x628),(long)local_68);
      local_10 = local_68[0];
    }
    switch(*(undefined4 *)(in_RDI + 4)) {
    case 1:
      std::istream::read((char *)(in_RDI + 0x218),(long)&local_69);
      local_8 = (uint)local_69;
      break;
    case 2:
      std::istream::read((char *)(in_RDI + 0x218),(long)&local_6c);
      local_8 = (uint)local_6c;
      break;
    case 4:
      std::istream::read((char *)(in_RDI + 0x218),(long)&local_70);
      local_8 = local_70;
      break;
    case 8:
      std::istream::read((char *)(in_RDI + 0x218),(long)local_78);
      local_8 = local_78[0];
    }
    std::istream::read((char *)(in_RDI + 0x420),(long)&local_79);
    uStack_4 = CONCAT31(uStack_4._1_3_,local_79);
  }
  else {
    switch(*(undefined4 *)(in_RDI + 8)) {
    case 1:
      std::istream::read((char *)(in_RDI + 0x10),(long)local_19);
      local_10 = (uint)local_19[0];
      break;
    case 2:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_1c);
      local_10 = (uint)local_1c;
      break;
    case 4:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_20);
      local_10 = local_20;
      break;
    case 8:
      std::istream::read((char *)(in_RDI + 0x10),(long)local_28);
      local_10 = local_28[0];
    }
    switch(*(undefined4 *)(in_RDI + 0xc)) {
    case 1:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_29);
      uStack_c = (uint)local_29;
      break;
    case 2:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_2c);
      uStack_c = (uint)local_2c;
      break;
    case 4:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_30);
      uStack_c = local_30;
      break;
    case 8:
      std::istream::read((char *)(in_RDI + 0x10),(long)local_38);
      uStack_c = local_38[0];
    }
    switch(*(undefined4 *)(in_RDI + 4)) {
    case 1:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_39);
      local_8 = (uint)local_39;
      break;
    case 2:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_3c);
      local_8 = (uint)local_3c;
      break;
    case 4:
      std::istream::read((char *)(in_RDI + 0x10),(long)&local_40);
      local_8 = local_40;
      break;
    case 8:
      std::istream::read((char *)(in_RDI + 0x10),(long)local_48);
      local_8 = local_48[0];
    }
    std::istream::read((char *)(in_RDI + 0x10),(long)&local_49);
    uStack_4 = CONCAT31(uStack_4._1_3_,local_49);
  }
  tVar1.suff = uStack_c;
  tVar1.text = local_10;
  tVar1.lcp = local_8;
  tVar1._12_4_ = uStack_4;
  return tVar1;
}

Assistant:

t_GSA read_el(){

		t_GSA e;

		if(egsa){

			switch(da_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.text = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.text = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.text = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.text = x64; break;

			}

			switch(suff_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.suff = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.suff = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.suff = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.suff = x64; break;

			}

			switch(lcp_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.lcp = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.lcp = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.lcp = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.lcp = x64; break;

			}

			uint8_t x8;
			EGSA.read((char*)&x8, 1);
			e.bwt = x8;

		}else if(bcr){

			switch(suff_size){

				case 1 : uint8_t x8; GSA.read((char*)&x8, 1); e.suff = x8;  break;
				case 2 : uint16_t x16; GSA.read((char*)&x16, 2); e.suff = x16; break;
				case 4 : uint32_t x32; GSA.read((char*)&x32, 4); e.suff = x32; break;
				case 8 : uint64_t x64; GSA.read((char*)&x64, 8); e.suff = x64; break;

			}

			switch(da_size){

				case 1 : uint8_t x8; GSA.read((char*)&x8, 1); e.text = x8;  break;
				case 2 : uint16_t x16; GSA.read((char*)&x16, 2); e.text = x16; break;
				case 4 : uint32_t x32; GSA.read((char*)&x32, 4); e.text = x32; break;
				case 8 : uint64_t x64; GSA.read((char*)&x64, 8); e.text = x64; break;

			}

			switch(lcp_size){

				case 1 : uint8_t x8; LCP.read((char*)&x8, 1); e.lcp = x8;  break;
				case 2 : uint16_t x16; LCP.read((char*)&x16, 2); e.lcp = x16; break;
				case 4 : uint32_t x32; LCP.read((char*)&x32, 4); e.lcp = x32; break;
				case 8 : uint64_t x64; LCP.read((char*)&x64, 8); e.lcp = x64; break;

			}

			uint8_t x8;
			BWT.read((char*)&x8, 1);
			e.bwt = x8;

		}else{

			cout << "Error: missing index files." << endl;
			exit(1);

		}

		return e;

	}